

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool range_loop(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *closure;
  gravity_object_t *pgVar1;
  gravity_class_t *pgVar2;
  char *pcVar3;
  _Bool _Var4;
  gravity_fiber_t *fiber;
  nanotime_t nVar5;
  nanotime_t nVar6;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar7;
  gravity_value_t gVar8;
  gravity_value_t gVar9;
  gravity_value_t local_1058;
  gravity_value_t local_1048;
  char _buffer [4096];
  
  if (nargs < 2) {
    builtin_strncpy(_buffer + 0x10," of arguments.",0xf);
    _buffer[0] = 'I';
    _buffer[1] = 'n';
    _buffer[2] = 'c';
    _buffer[3] = 'o';
    _buffer[4] = 'r';
    _buffer[5] = 'r';
    _buffer[6] = 'e';
    _buffer[7] = 'c';
    _buffer[8] = 't';
    _buffer[9] = ' ';
    _buffer[10] = 'n';
    _buffer[0xb] = 'u';
    _buffer[0xc] = 'm';
    _buffer[0xd] = 'b';
    _buffer[0xe] = 'e';
    _buffer[0xf] = 'r';
  }
  else {
    if (args[1].isa == gravity_class_closure) {
      closure = args[1].field_1.p;
      pgVar1 = (args->field_1).p;
      gVar8 = *args;
      gVar9 = *args;
      pgVar2 = pgVar1->objclass;
      pcVar3 = pgVar1->identifier;
      nVar5 = nanotime();
      if ((long)pgVar2 < (long)pcVar3) {
        aVar7 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)pgVar1->objclass;
        pcVar3 = pgVar1->identifier;
        do {
          if ((long)pcVar3 < aVar7.n) {
LAB_00125c2d:
            nVar6 = nanotime();
            gVar9.field_1.p = (gravity_object_t *)(nVar6 - nVar5);
            gVar9.isa = gravity_class_int;
            gravity_vm_setslot(vm,gVar9,rindex);
            return true;
          }
          local_1048.isa = gravity_class_int;
          local_1048.field_1 = aVar7;
          _Var4 = gravity_vm_runclosure(vm,(gravity_closure_t *)closure,gVar9,&local_1048,1);
          aVar7.p = (gravity_object_t *)((long)&(aVar7.p)->isa + 1);
        } while (_Var4);
      }
      else {
        aVar7 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)pgVar1->objclass;
        pcVar3 = pgVar1->identifier;
        do {
          if (aVar7.n < (long)pcVar3) goto LAB_00125c2d;
          local_1058.isa = gravity_class_int;
          local_1058.field_1 = aVar7;
          _Var4 = gravity_vm_runclosure(vm,(gravity_closure_t *)closure,gVar8,&local_1058,1);
          aVar7.p = (gravity_object_t *)(aVar7.n + -1);
        } while (_Var4);
      }
      return false;
    }
    builtin_strncpy(_buffer + 0x10," a Closure.",0xc);
    _buffer[0] = 'A';
    _buffer[1] = 'r';
    _buffer[2] = 'g';
    _buffer[3] = 'u';
    _buffer[4] = 'm';
    _buffer[5] = 'e';
    _buffer[6] = 'n';
    _buffer[7] = 't';
    _buffer[8] = ' ';
    _buffer[9] = 'm';
    _buffer[10] = 'u';
    _buffer[0xb] = 's';
    _buffer[0xc] = 't';
    _buffer[0xd] = ' ';
    _buffer[0xe] = 'b';
    _buffer[0xf] = 'e';
  }
  fiber = gravity_vm_fiber(vm);
  gravity_fiber_seterror(fiber,_buffer);
  gVar8.field_1.n = 0;
  gVar8.isa = gravity_class_null;
  gravity_vm_setslot(vm,gVar8,rindex);
  return false;
}

Assistant:

static bool range_loop (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs < 2) RETURN_ERROR("Incorrect number of arguments.");
    if (!VALUE_ISA_CLOSURE(GET_VALUE(1))) RETURN_ERROR("Argument must be a Closure.");

    gravity_closure_t *closure = VALUE_AS_CLOSURE(GET_VALUE(1));    // closure to execute
    gravity_value_t value = GET_VALUE(0);                           // self parameter
    gravity_range_t *range = VALUE_AS_RANGE(value);
    bool is_forward = range->from < range->to;

    nanotime_t t1 = nanotime();
    if (is_forward) {
        register gravity_int_t n = range->to;
        register gravity_int_t i = range->from;
        while (i <= n) {
            if (!gravity_vm_runclosure(vm, closure, value, &VALUE_FROM_INT(i), 1)) return false;
            ++i;
        }
    } else {
        register gravity_int_t n = range->from;            // 5...1
        register gravity_int_t i = range->to;
        while (n >= i) {
            if (!gravity_vm_runclosure(vm, closure, value, &VALUE_FROM_INT(n), 1)) return false;
            --n;
        }
    }
    nanotime_t t2 = nanotime();
    RETURN_VALUE(VALUE_FROM_INT(t2-t1), rindex);
}